

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O3

Writer * __thiscall chatra::Writer::outPointer<chatra::Lock>(Writer *this,Lock *value)

{
  iterator iVar1;
  Writer *pWVar2;
  Lock *local_18;
  
  local_18 = value;
  iVar1 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->pointerMap)._M_h,&local_18);
  if (iVar1.super__Node_iterator_base<std::pair<const_void_*const,_unsigned_long>,_false>._M_cur !=
      (__node_type *)0x0) {
    pWVar2 = outRawInteger<unsigned_long>
                       (this,*(unsigned_long *)
                              ((long)iVar1.
                                     super__Node_iterator_base<std::pair<const_void_*const,_unsigned_long>,_false>
                                     ._M_cur + 0x10));
    return pWVar2;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

Writer& outPointer(const Type* value) {
		CHATRA_SAVE_TYPE_TAG(Pointer);
		chatra_assert(pointerMap.count(value) != 0);
		return out(pointerMap.at(value));
	}